

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O1

void Saig_ManExplorePaths_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int f,int fMax,Vec_Ptr_t *vSimInfo)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
LAB_0060cf77:
LAB_0060cf88:
  iVar5 = pObj->Id;
  if (((long)iVar5 < 0) || (vSimInfo->nSize <= iVar5)) goto LAB_0060d128;
  uVar4 = *(uint *)((long)vSimInfo->pArray[iVar5] + (long)(f >> 4) * 4) >>
          ((char)f * '\x02' & 0x1fU);
  if ((uVar4 & 2) != 0) {
    return;
  }
  Saig_ManSetAndDriveImplications_rec(p,pObj,f,fMax,vSimInfo);
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar3 = uVar2 & 7;
  if (uVar3 == 1) {
    __assert_fail("!Aig_ObjIsConst1(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                  ,0x153,
                  "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)");
  }
  if (uVar3 == 2) {
    bVar1 = p->nTruePis <= (pObj->field_0).CioId;
  }
  else {
    bVar1 = false;
  }
  if ((f == 0) && (bVar1)) {
    return;
  }
  if (uVar3 == 2) {
    if ((pObj->field_0).CioId < p->nTruePis) {
      if (fMax < 0) {
        return;
      }
      uVar4 = (pObj->field_0).CioId;
      iVar5 = fMax;
      goto LAB_0060d0de;
    }
    if (p->nTruePis <= (pObj->field_0).CioId) goto LAB_0060d08b;
  }
  if (uVar3 == 3) {
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  else {
    if ((uVar2 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                    ,0x16a,
                    "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                   );
    }
    Saig_ManExplorePaths_rec
              (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f,fMax,vSimInfo);
    if ((uVar4 & 3) == 2) {
      return;
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  goto LAB_0060cf88;
LAB_0060d0de:
  if (f != iVar5) {
    if (((int)uVar4 < 0) || (p->vCis->nSize <= (int)uVar4)) {
LAB_0060d128:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Saig_ManSetAndDriveImplications_rec(p,(Aig_Obj_t *)p->vCis->pArray[uVar4],iVar5,fMax,vSimInfo);
  }
  bVar1 = iVar5 < 1;
  iVar5 = iVar5 + -1;
  if (bVar1) {
    return;
  }
  goto LAB_0060d0de;
LAB_0060d08b:
  if (f < 1) {
    __assert_fail("f > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                  ,0x161,
                  "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)");
  }
  if ((pObj->field_0).CioId < p->nTruePis) {
    __assert_fail("Saig_ObjIsLo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                  ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
  }
  uVar4 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
  if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) goto LAB_0060d128;
  pObj = (Aig_Obj_t *)p->vCos->pArray[uVar4];
  f = f + -1;
  goto LAB_0060cf77;
}

Assistant:

void Saig_ManExplorePaths_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int f, int fMax, Vec_Ptr_t * vSimInfo )
{
    int Value = Saig_ManSimInfo2Get( vSimInfo, pObj, f );
    if ( Saig_ManSimInfo2IsOld( Value ) )
        return;
    Saig_ManSetAndDriveImplications_rec( p, pObj, f, fMax, vSimInfo );
    assert( !Aig_ObjIsConst1(pObj) );
    if ( Saig_ObjIsLo(p, pObj) && f == 0 )
        return;
    if ( Saig_ObjIsPi(p, pObj) )
    {
        // propagate implications of this assignment
        int i, iPiNum = Aig_ObjCioId(pObj);
        for ( i = fMax; i >= 0; i-- )
            if ( i != f )
                Saig_ManSetAndDriveImplications_rec( p, Aig_ManCi(p, iPiNum), i, fMax, vSimInfo );
        return;
    }
    if ( Saig_ObjIsLo( p, pObj ) )
    {
        assert( f > 0 );
        Saig_ManExplorePaths_rec( p, Saig_ObjLoToLi(p, pObj), f-1, fMax, vSimInfo );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( Value == SAIG_ZER_OLD )
    {
//        if ( (Aig_ObjId(pObj) & 1) == 0 )
            Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
//        else
//            Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
    else
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
}